

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmsrcf.cpp
# Opt level: O0

void __thiscall CVmSrcfTable::clear(CVmSrcfTable *this)

{
  long *in_RDI;
  size_t i;
  CVmSrcfEntry *this_00;
  ulong local_10;
  
  for (local_10 = 0; local_10 < (ulong)in_RDI[1]; local_10 = local_10 + 1) {
    this_00 = *(CVmSrcfEntry **)(*in_RDI + local_10 * 8);
    if (this_00 != (CVmSrcfEntry *)0x0) {
      CVmSrcfEntry::~CVmSrcfEntry(this_00);
      operator_delete(this_00,0x28);
    }
  }
  in_RDI[1] = 0;
  return;
}

Assistant:

void CVmSrcfTable::clear()
{
    size_t i;
    
    /* delete each entry */
    for (i = 0 ; i < list_used_ ; ++i)
        delete(list_[i]);

    /* 
     *   we no longer have any entries, but leave the list allocated in
     *   case we add entries again 
     */
    list_used_ = 0;
}